

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O3

bool spvtools::opt::analysis::anon_unknown_4::IsSubset(DecorationSet *a,DecorationSet *b)

{
  int iVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  _Rb_tree_header *p_Var5;
  _Self __tmp;
  bool bVar6;
  
  p_Var2 = (a->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = (b->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(a->_M_t)._M_impl.super__Rb_tree_header;
  p_Var4 = &(b->_M_t)._M_impl.super__Rb_tree_header;
  bVar6 = (_Rb_tree_header *)p_Var2 == p_Var5;
  if ((_Rb_tree_header *)p_Var3 != p_Var4 && !bVar6) {
    while( true ) {
      iVar1 = std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::compare
                        ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)(p_Var2 + 1),
                         (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)(p_Var3 + 1));
      if (iVar1 < 0) break;
      iVar1 = std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::compare
                        ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)(p_Var2 + 1),
                         (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)(p_Var3 + 1));
      if (iVar1 == 0) {
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      bVar6 = (_Rb_tree_header *)p_Var2 == p_Var5;
      if (bVar6) {
        return bVar6;
      }
      if ((_Rb_tree_header *)p_Var3 == p_Var4) {
        return bVar6;
      }
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool IsSubset(const DecorationSet& a, const DecorationSet& b) {
  auto it1 = a.begin();
  auto it2 = b.begin();

  while (it1 != a.end()) {
    if (it2 == b.end() || *it1 < *it2) {
      // |*it1| is in |a|, but not in |b|.
      return false;
    }
    if (*it1 == *it2) {
      // Found the element move to the next one.
      it1++;
      it2++;
    } else /* *it1 > *it2 */ {
      // Did not find |*it1| yet, check the next element in |b|.
      it2++;
    }
  }
  return true;
}